

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  long lVar11;
  ostream *poVar12;
  _Alloc_hider _Var13;
  ulong uVar14;
  runtime_error *this;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  byte *pbVar23;
  long lVar24;
  byte *pbVar25;
  byte *pbVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  double dVar30;
  double d;
  string s;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  printf("FLT_EVAL_METHOD = %d\n",0);
  dVar30 = pow(10.0,-308.0);
  if ((dVar30 != 1e-308) || (NAN(dVar30))) {
    puts(
        "It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308)."
        );
    printf("Aborting further tests.");
  }
  else {
    issue2093();
    std::__cxx11::string::string
              ((string *)&local_70,"1090544144181609348835077142190",(allocator *)&s);
    bVar10 = basic_test_64bit(&local_70,1.0905441441816094e+30);
    Assert(bVar10);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_90,"4503599627370496.5",(allocator *)&s);
    bVar10 = basic_test_64bit(&local_90,4503599627370496.0);
    Assert(bVar10);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_b0,"4503599627370497.5",(allocator *)&s);
    bVar10 = basic_test_64bit(&local_b0,4503599627370498.0);
    Assert(bVar10);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::string
              ((string *)&local_d0,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375"
               ,(allocator *)&s);
    bVar10 = basic_test_64bit(&local_d0,4.4501477170144023e-308);
    Assert(bVar10);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string
              ((string *)&local_f0,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375"
               ,(allocator *)&s);
    bVar10 = basic_test_64bit(&local_f0,2.225073858507201e-308);
    Assert(bVar10);
    std::__cxx11::string::~string((string *)&local_f0);
    issue63();
    issue40();
    issue23();
    issue32();
    issue50_fastpath();
    issue50_off_fastpath();
    issue23_2();
    unit_tests();
    uVar29 = 0xfffffece;
    while ((int)uVar29 < 0x135) {
      uVar28 = uVar29;
      if (uVar29 == 0x17) {
        uVar28 = 0x18;
      }
      putchar(0x2e);
      fflush((FILE *)0x0);
      lVar11 = (long)(int)uVar28;
      if (lVar11 + 0x16U < 0x2d) {
        if ((int)uVar28 < 0) {
          dVar30 = 1.0 / *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + lVar11 * -8);
        }
        else {
          dVar30 = *(double *)
                    (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                     power_of_ten + lVar11 * 8);
        }
      }
      else {
        uVar18 = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                            mantissa_64 + lVar11 * 8 + 0xa28);
        uVar17 = uVar18 << 0x3f;
        if ((uVar29 == 0xd2) || (uVar14 = uVar17, uVar29 == 0x7e)) {
          if (uVar17 == 0) {
            uVar14 = 0;
          }
          else {
            uVar14 = 1;
            if ((((*(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                              mantissa_128 + lVar11 * 8 + 0xa28) & 1) != 0) &&
                (lVar11 == 0x7e || lVar11 == 0xd2)) &&
               ((*(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                            mantissa_128 + lVar11 * 8 + 0xa28) >> 1 | uVar17) == 0xffffffffffffffff)
               ) goto LAB_00106c97;
          }
        }
        if ((((uint)uVar18 & 0xc00) == 0x400 && uVar14 == 0) && uVar28 < 0x18) {
LAB_00106c97:
          puts("failed to parse");
          printf(" 10 ^ %d ",(ulong)uVar28);
          return 1;
        }
        uVar17 = (uVar18 >> 10) + (ulong)(((uint)uVar18 >> 10 & 1) != 0);
        uVar18 = ((lVar11 * 0x3526a >> 0x10) + 0x43f) - (0x40 - (ulong)(0x3fffffffffffff < uVar17));
        if ((uVar18 == 0) || (0x7fe < uVar18)) goto LAB_00106c97;
        uVar14 = 0;
        if (uVar17 < 0x40000000000000) {
          uVar14 = uVar17 >> 1 & 0x2fffffffffffff;
        }
        dVar30 = (double)(uVar18 << 0x34 | uVar14);
      }
      dVar1 = testing_power_of_ten[lVar11 + 0x133];
      if ((dVar30 != dVar1) || (NAN(dVar30) || NAN(dVar1))) {
        printf(" 10 ^ %d ",(ulong)uVar28);
        puts("bad parsing");
        printf("got: %.*e\n",dVar30,0x10);
        printf("reference: %.*e\n",dVar1,0x10);
        return 1;
      }
      uVar29 = uVar28 + 1;
    }
    for (lVar11 = -0x132; lVar11 != 0x135; lVar11 = lVar11 + 1) {
      std::__cxx11::to_string(&local_50,(int)lVar11);
      std::operator+(&s,"1e",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      poVar12 = std::operator<<((ostream *)&std::cout,"parsing ");
      poVar12 = std::operator<<(poVar12,(string *)&s);
      std::endl<char,std::char_traits<char>>(poVar12);
      bVar2 = *s._M_dataplus._M_p;
      _Var13 = s._M_dataplus;
      bVar15 = bVar2;
      if (bVar2 == 0x2d) {
        bVar15 = s._M_dataplus._M_p[1];
        if ((byte)(bVar15 - 0x30) < 10) {
          _Var13._M_p = s._M_dataplus._M_p + 1;
          goto LAB_001067d7;
        }
LAB_00106cb6:
        printf("fast_double_parser refused to parse %s\n",s._M_dataplus._M_p);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"fast_double_parser refused to parse");
LAB_00106d83:
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_001067d7:
      if (bVar15 != 0x30) {
        if ((byte)(bVar15 - 0x30) < 10) {
          uVar18 = (ulong)(byte)(bVar15 - 0x30);
          pbVar25 = (byte *)_Var13._M_p;
          while( true ) {
            pbVar25 = pbVar25 + 1;
            bVar21 = *pbVar25;
            if (9 < (byte)(bVar21 - 0x30)) break;
            uVar18 = (ulong)(byte)(bVar21 - 0x30) + uVar18 * 10;
          }
          goto LAB_001067f4;
        }
        goto LAB_00106cb6;
      }
      bVar21 = ((byte *)_Var13._M_p)[1];
      if ((byte)(bVar21 - 0x30) < 10) goto LAB_00106cb6;
      pbVar25 = (byte *)_Var13._M_p + 1;
      uVar18 = 0;
LAB_001067f4:
      if (bVar21 == 0x2e) {
        bVar16 = pbVar25[1] - 0x30;
        if (9 < bVar16) goto LAB_00106cb6;
        pbVar23 = pbVar25 + 1;
        lVar27 = 0;
        pbVar25 = pbVar23;
        do {
          uVar18 = (ulong)bVar16 + uVar18 * 10;
          bVar21 = pbVar25[1];
          pbVar25 = pbVar25 + 1;
          bVar16 = bVar21 - 0x30;
          lVar27 = lVar27 + -1;
        } while (bVar16 < 10);
        iVar22 = (int)pbVar23 - (int)lVar27;
      }
      else {
        iVar22 = (int)pbVar25;
        lVar27 = 0;
      }
      if ((bVar21 | 0x20) == 0x65) {
        pbVar23 = pbVar25 + 1;
        bVar10 = (*pbVar23 - 0x2b & 0xfd) == 0;
        pbVar26 = pbVar25 + 1;
        if (bVar10) {
          pbVar26 = pbVar25 + 2;
        }
        bVar21 = pbVar25[(ulong)bVar10 + 1] - 0x30;
        if (9 < bVar21) goto LAB_00106cb6;
        bVar16 = pbVar26[1] - 0x30;
        uVar17 = (ulong)bVar21 * 10 + (ulong)bVar16;
        if (9 < bVar16) {
          uVar17 = (ulong)bVar21;
        }
        pbVar25 = pbVar26 + 2;
        if (9 < bVar16) {
          pbVar25 = pbVar26 + 1;
        }
        bVar21 = pbVar26[(ulong)(bVar16 < 10) + 1] - 0x30;
        pbVar25 = pbVar25 + (bVar21 < 10);
        uVar14 = uVar17 * 10 + (ulong)bVar21;
        if (9 < bVar21) {
          uVar14 = uVar17;
        }
        for (; (byte)(*pbVar25 - 0x30) < 10; pbVar25 = pbVar25 + 1) {
          if ((long)uVar14 < 0x100000000) {
            uVar14 = (ulong)(byte)(*pbVar25 - 0x30) + uVar14 * 10;
          }
        }
        uVar17 = -uVar14;
        if (*pbVar23 != 0x2d) {
          uVar17 = uVar14;
        }
        lVar27 = lVar27 + uVar17;
      }
      if ((int)(~(uint)_Var13._M_p + iVar22) < 0x13) {
LAB_00106989:
        if (lVar27 - 0x135U < 0xfffffffffffffd86) goto LAB_00106998;
        if ((uVar18 >> 0x35 == 0) && (lVar27 + 0x16U < 0x2d)) {
          if (lVar27 < 0) {
            d = (double)(long)uVar18 /
                *(double *)
                 (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::power_of_ten
                 + lVar27 * -8);
          }
          else {
            d = (double)(long)uVar18 *
                *(double *)
                 (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::power_of_ten
                 + lVar27 * 8);
          }
          if (bVar2 == 0x2d) {
            d = -d;
          }
        }
        else {
          if (uVar18 != 0) {
            uVar17 = 0x3f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            uVar18 = uVar18 << ((byte)(uVar17 ^ 0x3f) & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar18;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                      compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64 +
                                     lVar27 * 8 + 0xa28);
            auVar3 = auVar3 * auVar5;
            uVar14 = auVar3._0_8_;
            uVar19 = auVar3._8_8_ & 0x1ff;
            auVar5 = auVar3;
            if ((uVar19 == 0x1ff) && (uVar19 = 0x1ff, CARRY8(uVar14,uVar18))) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar18;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::
                                        mantissa_128 + lVar27 * 8 + 0xa28);
              uVar20 = SUB168(auVar4 * auVar6,8);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar20;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = uVar20;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar20;
              uVar29 = auVar3._8_4_ + (uint)CARRY8(uVar14,uVar20) & 0x1ff;
              uVar19 = (ulong)uVar29;
              auVar5 = auVar3 + auVar9;
              if ((!CARRY8(SUB168(auVar4 * auVar6,0),uVar18)) ||
                 ((auVar5 = auVar3 + auVar8, uVar14 + uVar20 != -1 ||
                  (auVar5 = auVar3 + auVar7, uVar29 != 0x1ff)))) goto LAB_00106a2e;
            }
            else {
LAB_00106a2e:
              uVar18 = auVar5._8_8_ >> (9U - (auVar5[0xf] >> 7) & 0x3f);
              uVar29 = (uint)uVar18;
              if ((auVar5._0_8_ != 0) || ((uVar19 != 0 || ((uVar29 & 3) != 1)))) {
                uVar18 = (uVar29 & 1) + uVar18;
                uVar17 = ((lVar27 * 0x3526a >> 0x10) + 0x43f) -
                         (((auVar5._8_8_ >> 0x3f ^ 1) + (uVar17 ^ 0x3f)) -
                         (ulong)(0x3fffffffffffff < uVar18));
                if ((uVar17 != 0) && (uVar17 < 0x7ff)) {
                  uVar14 = 0;
                  if (uVar18 < 0x40000000000000) {
                    uVar14 = uVar18 >> 1 & 0xefffffffffffff;
                  }
                  d = (double)((ulong)(bVar2 == 0x2d) << 0x3f | uVar14 | uVar17 << 0x34);
                  goto LAB_00106b1d;
                }
              }
            }
            d = 0.0;
            goto LAB_00106998;
          }
          d = -0.0;
          if (bVar2 != 0x2d) {
            d = 0.0;
          }
        }
      }
      else {
        lVar24 = 1;
        while ((bVar15 == 0x30 || (bVar15 == 0x2e))) {
          pbVar23 = (byte *)_Var13._M_p + lVar24;
          lVar24 = lVar24 + 1;
          bVar15 = *pbVar23;
        }
        if ((int)((iVar22 - (uint)_Var13._M_p) - (int)lVar24) < 0x13) goto LAB_00106989;
LAB_00106998:
        pbVar25 = (byte *)fast_double_parser::parse_float_strtod(s._M_dataplus._M_p,&d);
        if (pbVar25 == (byte *)0x0) goto LAB_00106cb6;
      }
LAB_00106b1d:
      dVar30 = d;
      if (pbVar25 != (byte *)(s._M_dataplus._M_p + s._M_string_length)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"does not point at the end");
        goto LAB_00106d83;
      }
      dVar1 = testing_power_of_ten[lVar11 + 0x133];
      if ((d != dVar1) || (NAN(d) || NAN(dVar1))) {
        poVar12 = std::operator<<((ostream *)&std::cerr,"fast_double_parser disagrees");
        std::endl<char,std::char_traits<char>>(poVar12);
        printf("fast_double_parser: %.*e\n",dVar30,0x10);
        printf("reference: %.*e\n",dVar1,0x10);
        printf("string: %s\n",s._M_dataplus._M_p);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"fast_double_parser disagrees");
        goto LAB_00106d83;
      }
      std::__cxx11::string::~string((string *)&s);
    }
    negative_subsubnormal_to_negative_zero();
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar12 = std::operator<<((ostream *)&std::cout,"All ok");
    std::endl<char,std::char_traits<char>>(poVar12);
    puts("Good!");
  }
  return 0;
}

Assistant:

int main() {
  const int evl_method = FLT_EVAL_METHOD;
  printf("FLT_EVAL_METHOD = %d\n", evl_method);
  bool is_pow_correct{1e-308 == std::pow(10,-308)};
  if(!is_pow_correct) {
    printf("It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308).\n");
    printf("Aborting further tests.");
    return EXIT_SUCCESS;
  } 
  issue2093();
  Assert(basic_test_64bit("1090544144181609348835077142190",0x1.b8779f2474dfbp+99));
  Assert(basic_test_64bit("4503599627370496.5", 4503599627370496.5));
  Assert(basic_test_64bit("4503599627370497.5", 4503599627370497.5));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375));
  issue63();
  issue40();
  issue23();
  issue32();
  issue50_fastpath();
  issue50_off_fastpath();
  issue23_2();
  unit_tests();
  for (int p = -306; p <= 308; p++) {
    if (p == 23)
      p++;
    printf(".");
    fflush(NULL);
    bool success;
    double d = fast_double_parser::compute_float_64(p, 1, false, &success);
    if (!success) {
      printf("failed to parse\n");
      printf(" 10 ^ %d ", p);

      return EXIT_FAILURE;
    }
    if (d != testing_power_of_ten[p + 307]) {
      printf(" 10 ^ %d ", p);

      printf("bad parsing\n");
      printf("got: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);

      return EXIT_FAILURE;
    }
  }
  for (int p = -306; p <= 308; p++) {
    double d;
    std::string s = "1e"+std::to_string(p);
    std::cout << "parsing " << s << std::endl;
    const char * isok = fast_double_parser::parse_number(s.c_str(), &d);
    if (!isok) {
      printf("fast_double_parser refused to parse %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser refused to parse");
    }
    if(isok != s.c_str() + s.size()) throw std::runtime_error("does not point at the end");
    if (d != testing_power_of_ten[p + 307]) {
      std::cerr << "fast_double_parser disagrees" << std::endl;
      printf("fast_double_parser: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);
      printf("string: %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser disagrees");
    }
  }
  negative_subsubnormal_to_negative_zero();
  std::cout << std::endl;
  std::cout << "All ok" << std::endl;
  printf("Good!\n");
  return EXIT_SUCCESS;
}